

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<std::complex<long_double>_>::Subst_Forward
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *B)

{
  int iVar1;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar5;
  unkbyte10 in_ST0;
  unkbyte10 Var6;
  unkbyte10 in_ST1;
  unkbyte10 Var7;
  longdouble lVar8;
  unkbyte10 in_ST2;
  longdouble lVar9;
  unkbyte10 in_ST3;
  complex<long_double> __r;
  complex<long_double> pivot;
  unkbyte10 Var10;
  unkbyte10 Var11;
  complex<long_double> local_b8;
  undefined8 local_98 [4];
  unkbyte10 local_78;
  unkbyte10 local_68;
  complex<long_double> local_58;
  
  lVar3 = (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar2 = 0;
  if ((lVar3 == CONCAT44(extraout_var,iVar1)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    iVar2 = 1;
    if (CONCAT44(extraout_var_00,iVar1) != 0 && -1 < extraout_var_00) {
      lVar3 = 0;
      do {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_78,this,lVar3,lVar3);
        if (0 < (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol) {
          lVar5 = 0;
          do {
            lVar9 = (longdouble)0;
            lVar8 = lVar9;
            Var6 = in_ST0;
            Var7 = in_ST1;
            if (lVar3 != 0) {
              lVar4 = 0;
              lVar9 = (longdouble)0;
              lVar8 = lVar9;
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (local_98,this,lVar3,lVar4);
                (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                  super_TPZSavable._vptr_TPZSavable[0x24])(&local_58,B,lVar4,lVar5);
                local_b8._M_value._16_8_ = local_98[2];
                local_b8._M_value._24_2_ = (undefined2)local_98[3];
                local_b8._M_value._26_4_ = local_98[3]._2_4_;
                local_b8._M_value._30_2_ = local_98[3]._6_2_;
                local_b8._M_value._0_8_ = local_98[0];
                local_b8._M_value._8_2_ = (undefined2)local_98[1];
                local_b8._M_value._10_4_ = local_98[1]._2_4_;
                local_b8._M_value._14_2_ = local_98[1]._6_2_;
                std::complex<long_double>::operator*=(&local_b8,&local_58);
                lVar9 = (longdouble)CONCAT28(local_b8._M_value._8_2_,local_b8._M_value._0_8_) +
                        lVar9;
                lVar8 = (longdouble)CONCAT28(local_b8._M_value._24_2_,local_b8._M_value._16_8_) +
                        lVar8;
                lVar4 = lVar4 + 1;
              } while (lVar3 != lVar4);
            }
            in_ST1 = in_ST3;
            in_ST0 = in_ST2;
            (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(local_98,B,lVar3,lVar5);
            lVar9 = (longdouble)CONCAT28((undefined2)local_98[1],local_98[0]) - lVar9;
            local_b8._M_value._14_2_ = local_98[1]._6_2_;
            local_b8._M_value._10_4_ = local_98[1]._2_4_;
            lVar8 = (longdouble)CONCAT28((undefined2)local_98[3],local_98[2]) - lVar8;
            local_b8._M_value._30_2_ = local_98[3]._6_2_;
            local_b8._M_value._26_4_ = local_98[3]._2_4_;
            local_b8._M_value._0_8_ = SUB108(lVar9,0);
            local_b8._M_value._8_2_ = SUB102((unkuint10)lVar9 >> 0x40,0);
            local_b8._M_value._16_8_ = SUB108(lVar8,0);
            local_b8._M_value._24_2_ = SUB102((unkuint10)lVar8 >> 0x40,0);
            in_ST2 = in_ST1;
            in_ST3 = in_ST1;
            Var10 = local_78;
            Var11 = local_68;
            __divxc3();
            local_b8._M_value._0_8_ = SUB108(Var6,0);
            local_b8._M_value._8_2_ = SUB102((unkuint10)Var6 >> 0x40,0);
            local_b8._M_value._16_8_ = SUB108(Var7,0);
            local_b8._M_value._24_2_ = SUB102((unkuint10)Var7 >> 0x40,0);
            (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x23])(B,lVar3,lVar5,&local_b8,in_R8,in_R9,lVar9,lVar8,Var10,Var11);
            lVar5 = lVar5 + 1;
          } while (lVar5 < (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                  );
        }
        lVar3 = lVar3 + 1;
        iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
      } while (lVar3 < CONCAT44(extraout_var_01,iVar1));
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int TPZMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky)
		return( 0 );
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols();  c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
			//
			TVar sum = 0.0;
			for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
			// Faz B[r,c] = (B[r,c] - sum) / A[r,r].
			//
			B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
		}
	}
	return( 1 );
}